

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawSplineBasis(Vector2 *points,int pointCount,float thick,Color color)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  float fVar5;
  Vector2 VVar4;
  float radius;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  Vector2 vertices [50];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  Vector2 local_1c8;
  float afStack_1c0 [100];
  
  if (3 < pointCount) {
    memset(afStack_1c0 + 2,0,0x180);
    radius = thick * 0.5;
    fVar6 = 0.0;
    fVar8 = 0.0;
    fVar13 = 0.0;
    local_228 = 0.0;
    fStack_224 = 0.0;
    fStack_220 = 0.0;
    fStack_21c = 0.0;
    fVar14 = 0.0;
    fVar15 = 0.0;
    uVar3 = 0;
    while (uVar3 != pointCount - 3) {
      fVar7 = points[uVar3].x;
      fVar9 = points[uVar3].y;
      fVar6 = points[uVar3 + 1].x;
      fVar8 = points[uVar3 + 1].y;
      fVar10 = points[uVar3 + 2].x;
      fVar11 = points[uVar3 + 2].y;
      VVar4 = points[uVar3 + 3];
      auVar19._0_4_ = fVar6 * 4.0 + fVar7 + fVar10;
      auVar19._4_4_ = fVar8 * 4.0 + fVar9 + fVar11;
      auVar19._8_8_ = 0;
      auVar19 = divps(auVar19,_DAT_0017df60);
      fVar18 = auVar19._0_4_;
      fVar5 = auVar19._4_4_;
      if (uVar3 == 0) {
        DrawCircleV(auVar19._0_8_,radius,color);
      }
      else {
        local_228 = fVar13 * fVar15 + fVar18;
        fStack_224 = -fVar14 * fVar13 + fVar5;
        fStack_220 = -fVar15 * fVar13 + fVar18;
        fStack_21c = fVar13 * fVar14 + fVar5;
      }
      auVar12._0_4_ = fVar10 * -3.0 + (fVar6 * 3.0 - fVar7) + VVar4.x;
      auVar12._4_4_ = fVar11 * -3.0 + (fVar8 * 3.0 - fVar9) + VVar4.y;
      auVar12._8_8_ = 0;
      auVar17._0_4_ = fVar7 * 3.0 + fVar6 * -6.0 + fVar10 * 3.0;
      auVar17._4_4_ = fVar9 * 3.0 + fVar8 * -6.0 + fVar11 * 3.0;
      auVar17._8_8_ = 0;
      auVar16._0_4_ = fVar7 * -3.0 + fVar10 * 3.0;
      auVar16._4_4_ = fVar9 * -3.0 + fVar11 * 3.0;
      auVar16._8_8_ = 0;
      auVar19 = divps(auVar12,_DAT_0017df60);
      auVar12 = divps(auVar17,_DAT_0017df60);
      auVar17 = divps(auVar16,_DAT_0017df60);
      iVar1 = 1;
      fVar6 = fVar18;
      fVar8 = fVar5;
      for (lVar2 = 0x10; lVar2 != 400; lVar2 = lVar2 + 0x10) {
        fVar13 = (float)iVar1 / 24.0;
        fVar7 = ((fVar13 * auVar19._0_4_ + auVar12._0_4_) * fVar13 + auVar17._0_4_) * fVar13 +
                fVar18;
        fVar9 = ((fVar13 * auVar19._4_4_ + auVar12._4_4_) * fVar13 + auVar17._4_4_) * fVar13 + fVar5
        ;
        fVar14 = fVar7 - fVar6;
        fVar15 = fVar9 - fVar8;
        fVar13 = radius / SQRT(fVar14 * fVar14 + fVar15 * fVar15);
        if (lVar2 == 0x10 && uVar3 == 0) {
          local_228 = fVar15 * fVar13 + fVar6;
          fStack_224 = -fVar14 * fVar13 + fVar8;
          fStack_220 = -fVar15 * fVar13 + fVar6;
          fStack_21c = fVar13 * fVar14 + fVar8;
        }
        *(float *)((long)&local_1c8.x + lVar2) = fVar13 * fVar15 + fVar7;
        *(float *)((long)afStack_1c0 + lVar2 + -4) = fVar13 * -fVar14 + fVar9;
        *(float *)((long)afStack_1c0 + lVar2) = fVar13 * -fVar15 + fVar7;
        *(float *)((long)afStack_1c0 + lVar2 + 4) = fVar13 * fVar14 + fVar9;
        iVar1 = iVar1 + 1;
        fVar6 = fVar7;
        fVar8 = fVar9;
      }
      local_1c8.x = local_228;
      local_1c8.y = fStack_224;
      afStack_1c0[0] = fStack_220;
      afStack_1c0[1] = fStack_21c;
      DrawTriangleStrip(&local_1c8,0x32,color);
      uVar3 = uVar3 + 1;
    }
    VVar4.y = fVar8;
    VVar4.x = fVar6;
    DrawCircleV(VVar4,radius,color);
  }
  return;
}

Assistant:

void DrawSplineBasis(const Vector2 *points, int pointCount, float thick, Color color)
{
    if (pointCount < 4) return;

    float a[4] = { 0 };
    float b[4] = { 0 };
    float dy = 0.0f;
    float dx = 0.0f;
    float size = 0.0f;

    Vector2 currentPoint = { 0 };
    Vector2 nextPoint = { 0 };
    Vector2 vertices[2*SPLINE_SEGMENT_DIVISIONS + 2] = { 0 };

    for (int i = 0; i < (pointCount - 3); i++)
    {
        float t = 0.0f;
        Vector2 p1 = points[i], p2 = points[i + 1], p3 = points[i + 2], p4 = points[i + 3];

        a[0] = (-p1.x + 3.0f*p2.x - 3.0f*p3.x + p4.x)/6.0f;
        a[1] = (3.0f*p1.x - 6.0f*p2.x + 3.0f*p3.x)/6.0f;
        a[2] = (-3.0f*p1.x + 3.0f*p3.x)/6.0f;
        a[3] = (p1.x + 4.0f*p2.x + p3.x)/6.0f;

        b[0] = (-p1.y + 3.0f*p2.y - 3.0f*p3.y + p4.y)/6.0f;
        b[1] = (3.0f*p1.y - 6.0f*p2.y + 3.0f*p3.y)/6.0f;
        b[2] = (-3.0f*p1.y + 3.0f*p3.y)/6.0f;
        b[3] = (p1.y + 4.0f*p2.y + p3.y)/6.0f;

        currentPoint.x = a[3];
        currentPoint.y = b[3];

        if (i == 0) DrawCircleV(currentPoint, thick/2.0f, color);   // Draw init line circle-cap

        if (i > 0)
        {
            vertices[0].x = currentPoint.x + dy*size;
            vertices[0].y = currentPoint.y - dx*size;
            vertices[1].x = currentPoint.x - dy*size;
            vertices[1].y = currentPoint.y + dx*size;
        }

        for (int j = 1; j <= SPLINE_SEGMENT_DIVISIONS; j++)
        {
            t = ((float)j)/((float)SPLINE_SEGMENT_DIVISIONS);

            nextPoint.x = a[3] + t*(a[2] + t*(a[1] + t*a[0]));
            nextPoint.y = b[3] + t*(b[2] + t*(b[1] + t*b[0]));

            dy = nextPoint.y - currentPoint.y;
            dx = nextPoint.x - currentPoint.x;
            size = 0.5f*thick/sqrtf(dx*dx+dy*dy);

            if ((i == 0) && (j == 1))
            {
                vertices[0].x = currentPoint.x + dy*size;
                vertices[0].y = currentPoint.y - dx*size;
                vertices[1].x = currentPoint.x - dy*size;
                vertices[1].y = currentPoint.y + dx*size;
            }

            vertices[2*j + 1].x = nextPoint.x - dy*size;
            vertices[2*j + 1].y = nextPoint.y + dx*size;
            vertices[2*j].x = nextPoint.x + dy*size;
            vertices[2*j].y = nextPoint.y - dx*size;

            currentPoint = nextPoint;
        }

        DrawTriangleStrip(vertices, 2*SPLINE_SEGMENT_DIVISIONS + 2, color);
    }

    // Cap circle drawing at the end of every segment
    DrawCircleV(currentPoint, thick/2.0f, color);
}